

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int __thiscall ON_MappingRef::Compare(ON_MappingRef *this,ON_MappingRef *other)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  iVar2 = ON_UuidCompare(&this->m_plugin_id,&other->m_plugin_id);
  if (iVar2 == 0) {
    uVar1 = (this->m_mapping_channels).m_count;
    iVar2 = uVar1 - (other->m_mapping_channels).m_count;
    if (iVar2 == 0) {
      if ((int)uVar1 < 1) {
        iVar2 = 0;
      }
      else {
        lVar4 = 0;
        uVar3 = 1;
        do {
          iVar2 = ON_MappingChannel::Compare
                            ((ON_MappingChannel *)
                             ((((this->m_mapping_channels).m_a)->m_mapping_id).Data4 + lVar4 + -8),
                             (ON_MappingChannel *)
                             ((((other->m_mapping_channels).m_a)->m_mapping_id).Data4 + lVar4 + -8))
          ;
          if (iVar2 != 0) {
            return iVar2;
          }
          lVar4 = lVar4 + 0x98;
          bVar5 = uVar3 < uVar1;
          iVar2 = 0;
          uVar3 = uVar3 + 1;
        } while (bVar5);
      }
    }
  }
  return iVar2;
}

Assistant:

int ON_MappingRef::Compare( const ON_MappingRef& other ) const
{
  int rc = ON_UuidCompare(m_plugin_id,other.m_plugin_id);
  if ( !rc)
  {
    const int count = m_mapping_channels.Count();
    rc = count - other.m_mapping_channels.Count();
    if (!rc)
    {
      for ( int i = 0; i < count && !rc; i++ )
      {
        rc = m_mapping_channels[i].Compare(other.m_mapping_channels[i]);
      }
    }
  }
  return rc;
}